

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O1

ConsumeResult * __thiscall
binlog::Session::consume<std::ofstream>
          (ConsumeResult *__return_storage_ptr__,Session *this,
          basic_ofstream<char,_std::char_traits<char>_> *out)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *entry;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var5;
  ulong uVar6;
  int iVar7;
  size_t sVar8;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  undefined8 uVar9;
  long lVar10;
  uint64_t uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  shared_ptr<binlog::Session::Channel> *channelptr;
  pointer psVar16;
  bool bVar17;
  pthread_mutex_t *local_60;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar7 != 0) {
    uVar9 = std::__throw_system_error(iVar7);
    pthread_mutex_unlock(local_60);
    _Unwind_Resume(uVar9);
  }
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    std::ostream::write((char *)out,
                        (long)((this->_clockSync)._vector.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18));
    __return_storage_ptr__->bytesConsumed =
         (size_t)((this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (__return_storage_ptr__->bytesConsumed -
                 (long)(this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start) + -0x18);
    this->_consumeClockSync = false;
  }
  pcVar1 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (-(long)pcVar1 - this->_sourcesConsumePos) + -0x18;
  std::ostream::write((char *)out,(long)(pcVar1 + this->_sourcesConsumePos + 0x18));
  this->_sourcesConsumePos = (streamsize)(pcVar2 + this->_sourcesConsumePos + lVar13);
  __return_storage_ptr__->bytesConsumed =
       (size_t)(pcVar2 + __return_storage_ptr__->bytesConsumed + lVar13);
  psVar16 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->_channels).
           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar16 == psVar3) {
      __first = std::
                __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<std::ofstream>(std::ofstream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                          ((this->_channels).
                           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->_channels).
                           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
      ::_M_erase(&this->_channels,(iterator)__first._M_current,
                 (this->_channels).
                 super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      sVar8 = this->_totalConsumedBytes + __return_storage_ptr__->bytesConsumed;
      this->_totalConsumedBytes = sVar8;
      __return_storage_ptr__->totalBytesConsumed = sVar8;
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return __return_storage_ptr__;
    }
    p_Var4 = (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar17 = false;
    }
    else {
      bVar17 = p_Var4->_M_use_count == 1;
    }
    entry = (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
    _Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>;
    uVar6 = *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
    uVar12 = *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
    if (uVar6 < uVar12) {
      lVar10 = *(long *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
      uVar14 = *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) -
               uVar12;
      lVar13 = lVar10;
      uVar15 = uVar6;
      if (*(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) < uVar12
          || uVar14 == 0) goto LAB_00102df3;
      lVar13 = uVar12 + lVar10;
      uVar12 = uVar6;
      uVar15 = uVar14;
    }
    else {
      lVar13 = uVar12 + *(long *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl +
                                 0x28);
      uVar15 = uVar6 - uVar12;
LAB_00102df3:
      uVar12 = 0;
      lVar10 = 0;
    }
    uVar11 = uVar12 + uVar15;
    if (uVar11 != 0) {
      (entry->writerProp).batchSize = uVar11;
      sVar8 = consumeSpecialEntry<binlog::WriterProp,std::ofstream>(this,&entry->writerProp,out);
      __return_storage_ptr__->bytesConsumed = __return_storage_ptr__->bytesConsumed + sVar8;
      std::ostream::write((char *)out,lVar13);
      if (uVar12 != 0) {
        std::ostream::write((char *)out,lVar10);
      }
      *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = uVar6;
      __return_storage_ptr__->bytesConsumed = __return_storage_ptr__->bytesConsumed + uVar11;
    }
    if (bVar17) {
      p_Var4 = (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      __return_storage_ptr__->channelsRemoved = __return_storage_ptr__->channelsRemoved + 1;
    }
    __return_storage_ptr__->channelsPolled = __return_storage_ptr__->channelsPolled + 1;
    psVar16 = psVar16 + 1;
  } while( true );
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}